

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O3

void anon_unknown.dwarf_53cd95::contextDestroyCallback(void *param_1)

{
  long lVar1;
  Uint64 UVar2;
  iterator __position;
  _Rb_tree_node_base *p_Var3;
  GLuint frameBuffer;
  Lock lock;
  GLuint local_3c;
  Lock local_38;
  
  sf::Lock::Lock(&local_38,(Mutex *)&(anonymous_namespace)::mutex);
  UVar2 = sf::Context::getActiveContextId();
  if ((anonymous_namespace)::frameBuffers._24_8_ != 0x284588) {
    p_Var3 = (_Rb_tree_node_base *)(anonymous_namespace)::frameBuffers._24_8_;
    do {
      lVar1 = *(long *)(p_Var3 + 1);
      for (__position._M_node = *(_Base_ptr *)(lVar1 + 0x18);
          __position._M_node != (_Base_ptr)(lVar1 + 8);
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node)) {
        if (*(Uint64 *)(__position._M_node + 1) == UVar2) {
          local_3c = *(GLuint *)&__position._M_node[1]._M_parent;
          (*sf_glad_glDeleteFramebuffersEXT)(1,&local_3c);
          std::
          _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_int>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
          ::erase_abi_cxx11_(*(_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_int>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
                               **)(p_Var3 + 1),__position);
          break;
        }
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)((anonymous_namespace)::frameBuffers + 8));
  }
  destroyStaleFBOs();
  sf::Lock::~Lock(&local_38);
  return;
}

Assistant:

void contextDestroyCallback(void* /*arg*/)
    {
        sf::Lock lock(mutex);

        sf::Uint64 contextId = sf::Context::getActiveContextId();

        // Destroy active frame buffer objects
        for (std::set<std::map<sf::Uint64, unsigned int>*>::iterator frameBuffersIter = frameBuffers.begin(); frameBuffersIter != frameBuffers.end(); ++frameBuffersIter)
        {
            for (std::map<sf::Uint64, unsigned int>::iterator iter = (*frameBuffersIter)->begin(); iter != (*frameBuffersIter)->end(); ++iter)
            {
                if (iter->first == contextId)
                {
                    GLuint frameBuffer = iter->second;
                    glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

                    // Erase the entry from the RenderTextureImplFBO's map
                    (*frameBuffersIter)->erase(iter);

                    break;
                }
            }
        }

        // Destroy stale frame buffer objects
        destroyStaleFBOs();
    }